

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

string * __thiscall
fmt::v5::format<char_const*>
          (string *__return_storage_ptr__,v5 *this,string_view format_str,char **args)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  in_R9;
  string_view format_str_00;
  format_args args_00;
  format_args local_58;
  v5 *local_48;
  char *local_40;
  undefined1 local_38 [8];
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_const_char_*>
  as;
  char **args_local;
  string_view format_str_local;
  
  as.data_[0].field_0.string.size = format_str.size_;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_const_char_*>
  ::format_arg_store((format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_const_char_*>
                      *)local_38,(char **)as.data_[0].field_0.custom.format);
  local_48 = this;
  local_40 = format_str.data_;
  format_args::
  format_args<fmt::v5::format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>&>
            (&local_58,
             (format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_const_char_*>
              *)local_38);
  format_str_00.size_ =
       local_58.
       super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
       .types_;
  format_str_00.data_ = local_40;
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .types_ = (unsigned_long_long)
            local_58.
            super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            .field_1.values_;
  vformat_abi_cxx11_(__return_storage_ptr__,local_48,format_str_00,args_00);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format(string_view format_str, const Args & ... args) {
  // This should be just
  // return vformat(format_str, make_format_args(args...));
  // but gcc has trouble optimizing the latter, so break it down.
  format_arg_store<format_context, Args...> as{args...};
  return vformat(format_str, as);
}